

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool ts_lex_keywords(TSLexer *lexer,TSStateId state)

{
  uint uVar1;
  ulong uVar2;
  _Bool _Var3;
  long lVar4;
  ulong uVar5;
  _Bool _Var6;
  bool bVar7;
  
  _Var6 = false;
  do {
    uVar1 = lexer->lookahead;
    (*lexer->eof)(lexer);
    switch(state) {
    case 0:
      if (uVar1 == 0x61) {
        lVar4 = 1;
        bVar7 = false;
      }
      else {
        uVar2 = 0;
        do {
          uVar5 = uVar2;
          bVar7 = 0x1d < uVar5;
          if (bVar7) goto LAB_0010343d;
          uVar2 = uVar5 + 2;
        } while (uVar1 != ts_lex_keywords::map[uVar5 + 2]);
        lVar4 = uVar5 + 3;
      }
      state = ts_lex_keywords::map[lVar4];
LAB_0010343d:
      if (!bVar7) break;
      if (0x20 < uVar1) {
        return _Var6;
      }
      if ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        return _Var6;
      }
      _Var3 = true;
      state = 0;
      goto LAB_00103558;
    case 1:
      if (uVar1 == 0x6e) {
        state = 0x11;
      }
      else if (uVar1 == 0x76) {
        state = 0x13;
      }
      else {
        if (uVar1 != 0x73) {
          return _Var6;
        }
        state = 0x12;
      }
      break;
    case 2:
      if (uVar1 == 0x6f) {
        state = 0x14;
      }
      else {
        if (uVar1 != 0x79) {
          return _Var6;
        }
        state = 0x15;
      }
      break;
    case 3:
      if (uVar1 == 0x6c) {
        state = 0x16;
      }
      else {
        if (uVar1 != 0x6f) {
          return _Var6;
        }
        state = 0x17;
      }
      break;
    case 4:
      if (uVar1 == 0x61) {
        state = 0x18;
      }
      else {
        if (uVar1 != 0x65) {
          return _Var6;
        }
        state = 0x19;
      }
      break;
    case 5:
      if (uVar1 == 0x6c) {
        state = 0x1a;
      }
      else {
        if (uVar1 != 0x78) {
          return _Var6;
        }
        state = 0x1b;
      }
      break;
    case 6:
      if ((int)uVar1 < 0x6f) {
        if (uVar1 == 0x61) {
          state = 0x1c;
        }
        else {
          if (uVar1 != 0x6c) {
            return _Var6;
          }
          state = 0x1d;
        }
      }
      else if (uVar1 == 0x6f) {
        state = 0x1e;
      }
      else {
        if (uVar1 != 0x72) {
          return _Var6;
        }
        state = 0x1f;
      }
      break;
    case 7:
      if (uVar1 == 0x66) {
        state = 0x20;
      }
      else if (uVar1 == 0x6e) {
        state = 0x22;
      }
      else {
        if (uVar1 != 0x6d) {
          return _Var6;
        }
        state = 0x21;
      }
      break;
    case 8:
      if (uVar1 == 0x61) {
        state = 0x23;
      }
      else if (uVar1 == 0x6f) {
        state = 0x25;
      }
      else {
        if (uVar1 != 0x69) {
          return _Var6;
        }
        state = 0x24;
      }
      break;
    case 9:
      if (uVar1 == 0x65) {
        state = 0x26;
      }
      else {
        if (uVar1 != 0x6f) {
          return _Var6;
        }
        state = 0x27;
      }
      break;
    case 10:
      if (uVar1 != 0x72) {
        return _Var6;
      }
      state = 0x28;
      break;
    case 0xb:
      if (uVar1 != 0x72) {
        return _Var6;
      }
      state = 0x29;
      break;
    case 0xc:
      if (uVar1 == 0x61) {
        state = 0x2a;
      }
      else {
        if (uVar1 != 0x65) {
          return _Var6;
        }
        state = 0x2b;
      }
      break;
    case 0xd:
      if (uVar1 == 0x65) {
        state = 0x2c;
      }
      else if (uVar1 == 0x75) {
        state = 0x2e;
      }
      else {
        if (uVar1 != 0x74) {
          return _Var6;
        }
        state = 0x2d;
      }
      break;
    case 0xe:
      if (uVar1 == 0x68) {
        state = 0x2f;
      }
      else {
        if (uVar1 != 0x72) {
          return _Var6;
        }
        state = 0x30;
      }
      break;
    case 0xf:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0x31;
      break;
    case 0x10:
      if (uVar1 != 0x68) {
        return _Var6;
      }
      state = 0x32;
      break;
    case 0x11:
      if (uVar1 == 100) {
        state = 0x33;
      }
      else {
        if (uVar1 != 0x79) {
          return _Var6;
        }
        state = 0x34;
      }
      break;
    case 0x12:
      lexer->result_symbol = 10;
      (*lexer->mark_end)(lexer);
      _Var6 = true;
      if (uVar1 != 99) {
        return true;
      }
      state = 0x35;
      break;
    case 0x13:
      if (uVar1 != 0x67) {
        return _Var6;
      }
      state = 0x36;
      break;
    case 0x14:
      if (uVar1 != 0x6f) {
        return _Var6;
      }
      state = 0x37;
      break;
    case 0x15:
      lexer->result_symbol = 0x33;
LAB_0010376c:
      (*lexer->mark_end)(lexer);
      return true;
    case 0x16:
      if (uVar1 != 0x61) {
        return _Var6;
      }
      state = 0x38;
      break;
    case 0x17:
      if (uVar1 == 0x6e) {
        state = 0x39;
      }
      else {
        if (uVar1 != 0x75) {
          return _Var6;
        }
        state = 0x3a;
      }
      break;
    case 0x18:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0x3b;
      break;
    case 0x19:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0x3c;
      break;
    case 0x1a:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0x3d;
      break;
    case 0x1b:
      if (uVar1 == 0x69) {
        state = 0x3e;
      }
      else {
        if (uVar1 != 0x74) {
          return _Var6;
        }
        state = 0x3f;
      }
      break;
    case 0x1c:
      if (uVar1 != 0x6c) {
        return _Var6;
      }
      state = 0x40;
      break;
    case 0x1d:
      if (uVar1 != 0x6f) {
        return _Var6;
      }
      state = 0x41;
      break;
    case 0x1e:
      if (uVar1 != 0x72) {
        return _Var6;
      }
      state = 0x42;
      break;
    case 0x1f:
      if (uVar1 != 0x6f) {
        return _Var6;
      }
      state = 0x43;
      break;
    case 0x20:
      lexer->result_symbol = 0x19;
      goto LAB_0010376c;
    case 0x21:
      if (uVar1 != 0x70) {
        return _Var6;
      }
      state = 0x44;
      break;
    case 0x22:
      lexer->result_symbol = 0x17;
      (*lexer->mark_end)(lexer);
      _Var6 = true;
      if (uVar1 == 0x73) {
        state = 0x45;
      }
      else {
        if (uVar1 != 0x74) {
          return true;
        }
        state = 0x46;
      }
      break;
    case 0x23:
      if (uVar1 != 0x78) {
        return _Var6;
      }
      state = 0x47;
      break;
    case 0x24:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0x48;
      break;
    case 0x25:
      if (uVar1 != 100) {
        return _Var6;
      }
      state = 0x49;
      break;
    case 0x26:
      if (uVar1 != 0x77) {
        return _Var6;
      }
      state = 0x4a;
      break;
    case 0x27:
      if (uVar1 == 0x6e) {
        state = 0x4b;
      }
      else {
        if (uVar1 != 0x74) {
          return _Var6;
        }
        state = 0x4c;
      }
      break;
    case 0x28:
      lexer->result_symbol = 0xd;
      (*lexer->mark_end)(lexer);
      _Var6 = true;
      if (uVar1 != 100) {
        return true;
      }
      state = 0x4d;
      break;
    case 0x29:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x4e;
      break;
    case 0x2a:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0x4f;
      break;
    case 0x2b:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0x50;
      break;
    case 0x2c:
      if (uVar1 != 0x6c) {
        return _Var6;
      }
      state = 0x51;
      break;
    case 0x2d:
      if (uVar1 != 0x72) {
        return _Var6;
      }
      state = 0x52;
      break;
    case 0x2e:
      if (uVar1 == 0x6d) {
        state = 0x53;
      }
      else {
        if (uVar1 != 0x70) {
          return _Var6;
        }
        state = 0x54;
      }
      break;
    case 0x2f:
      if (uVar1 == 0x65) {
        state = 0x55;
      }
      else {
        if (uVar1 != 0x69) {
          return _Var6;
        }
        state = 0x56;
      }
      break;
    case 0x30:
      if (uVar1 != 0x75) {
        return _Var6;
      }
      state = 0x57;
      break;
    case 0x31:
      if (uVar1 != 0x69) {
        return _Var6;
      }
      state = 0x58;
      break;
    case 0x32:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x59;
      break;
    case 0x33:
      lexer->result_symbol = 0x1c;
      goto LAB_0010376c;
    case 0x34:
      lexer->result_symbol = 0x46;
      goto LAB_0010376c;
    case 0x35:
      lexer->result_symbol = 0x30;
      goto LAB_0010376c;
    case 0x36:
      lexer->result_symbol = 0x3c;
      goto LAB_0010376c;
    case 0x37:
      if (uVar1 != 0x6c) {
        return _Var6;
      }
      state = 0x5a;
      break;
    case 0x38:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0x5b;
      break;
    case 0x39:
      if (uVar1 != 99) {
        return _Var6;
      }
      state = 0x5c;
      break;
    case 0x3a:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0x5d;
      break;
    case 0x3b:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x5e;
      break;
    case 0x3c:
      if (uVar1 != 99) {
        return _Var6;
      }
      state = 0x5f;
      break;
    case 0x3d:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x60;
      break;
    case 0x3e:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0x61;
      break;
    case 0x3f:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x62;
      break;
    case 0x40:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 99;
      break;
    case 0x41:
      if (uVar1 != 0x61) {
        return _Var6;
      }
      state = 100;
      break;
    case 0x42:
      if (uVar1 == 0x61) {
        state = 0x65;
      }
      else {
        if (uVar1 != 0x65) {
          return _Var6;
        }
        state = 0x66;
      }
      break;
    case 0x43:
      if (uVar1 != 0x6d) {
        return _Var6;
      }
      state = 0x67;
      break;
    case 0x44:
      if (uVar1 == 0x6c) {
        state = 0x68;
      }
      else {
        if (uVar1 != 0x6f) {
          return _Var6;
        }
        state = 0x69;
      }
      break;
    case 0x45:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0x6a;
      break;
    case 0x46:
      lexer->result_symbol = 0x39;
      goto LAB_0010376c;
    case 0x47:
      lexer->result_symbol = 0x40;
      goto LAB_0010376c;
    case 0x48:
      lexer->result_symbol = 0x41;
      goto LAB_0010376c;
    case 0x49:
      if (uVar1 != 0x75) {
        return _Var6;
      }
      state = 0x6b;
      break;
    case 0x4a:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0x6c;
      break;
    case 0x4b:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x6d;
      break;
    case 0x4c:
      lexer->result_symbol = 0x18;
      goto LAB_0010376c;
    case 0x4d:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x6e;
      break;
    case 0x4e:
      if (uVar1 != 100) {
        return _Var6;
      }
      state = 0x6f;
      break;
    case 0x4f:
      if (uVar1 != 0x6b) {
        return _Var6;
      }
      state = 0x70;
      break;
    case 0x50:
      if (uVar1 != 0x75) {
        return _Var6;
      }
      state = 0x71;
      break;
    case 0x51:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x72;
      break;
    case 0x52:
      if (uVar1 != 0x69) {
        return _Var6;
      }
      state = 0x73;
      break;
    case 0x53:
      lexer->result_symbol = 0x45;
      goto LAB_0010376c;
    case 0x54:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x74;
      break;
    case 0x55:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0x75;
      break;
    case 0x56:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0x76;
      break;
    case 0x57:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x77;
      break;
    case 0x58:
      if (uVar1 != 0x71) {
        return _Var6;
      }
      state = 0x78;
      break;
    case 0x59:
      if (uVar1 != 0x72) {
        return _Var6;
      }
      state = 0x79;
      break;
    case 0x5a:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x7a;
      break;
    case 0x5b:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0x7b;
      break;
    case 0x5c:
      if (uVar1 != 0x61) {
        return _Var6;
      }
      state = 0x7c;
      break;
    case 0x5d:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0x7d;
      break;
    case 0x5e:
      lexer->result_symbol = 0x37;
      goto LAB_0010376c;
    case 0x5f:
      lexer->result_symbol = 0x31;
      goto LAB_0010376c;
    case 0x60:
      lexer->result_symbol = 0x1b;
      goto LAB_0010376c;
    case 0x61:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0x7e;
      break;
    case 0x62:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0x7f;
      break;
    case 99:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x80;
      break;
    case 100:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0x81;
      break;
    case 0x65:
      if (uVar1 != 0x6c) {
        return _Var6;
      }
      state = 0x82;
      break;
    case 0x66:
      if (uVar1 != 0x78) {
        return _Var6;
      }
      state = 0x83;
      break;
    case 0x67:
      lexer->result_symbol = 0x11;
      goto LAB_0010376c;
    case 0x68:
      if (uVar1 == 0x65) {
        state = 0x84;
      }
      else {
        if (uVar1 != 0x69) {
          return _Var6;
        }
        state = 0x85;
      }
      break;
    case 0x69:
      if (uVar1 != 0x72) {
        return _Var6;
      }
      state = 0x86;
      break;
    case 0x6a:
      if (uVar1 != 0x61) {
        return _Var6;
      }
      state = 0x87;
      break;
    case 0x6b:
      if (uVar1 != 0x6c) {
        return _Var6;
      }
      state = 0x88;
      break;
    case 0x6c:
      if (uVar1 != 0x79) {
        return _Var6;
      }
      state = 0x89;
      break;
    case 0x6d:
      lexer->result_symbol = 0x1f;
      goto LAB_0010376c;
    case 0x6e:
      if (uVar1 != 0x72) {
        return _Var6;
      }
      state = 0x8a;
      break;
    case 0x6f:
      if (uVar1 != 0x69) {
        return _Var6;
      }
      state = 0x8b;
      break;
    case 0x70:
      lexer->result_symbol = 0x42;
      goto LAB_0010376c;
    case 0x71:
      if (uVar1 != 0x6c) {
        return _Var6;
      }
      state = 0x8c;
      break;
    case 0x72:
      if (uVar1 != 99) {
        return _Var6;
      }
      state = 0x8d;
      break;
    case 0x73:
      if (uVar1 == 99) {
        state = 0x8e;
      }
      else {
        if (uVar1 != 0x6e) {
          return _Var6;
        }
        state = 0x8f;
      }
      break;
    case 0x74:
      if (uVar1 != 0x72) {
        return _Var6;
      }
      state = 0x90;
      break;
    case 0x75:
      lexer->result_symbol = 0x1a;
      goto LAB_0010376c;
    case 0x76:
      lexer->result_symbol = 0x52;
      goto LAB_0010376c;
    case 0x77:
      lexer->result_symbol = 0x53;
      goto LAB_0010376c;
    case 0x78:
      if (uVar1 != 0x75) {
        return _Var6;
      }
      state = 0x91;
      break;
    case 0x79:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x92;
      break;
    case 0x7a:
      if (uVar1 != 0x61) {
        return _Var6;
      }
      state = 0x93;
      break;
    case 0x7b:
      lexer->result_symbol = 0x14;
      goto LAB_0010376c;
    case 0x7c:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0x94;
      break;
    case 0x7d:
      lexer->result_symbol = 0x3f;
      goto LAB_0010376c;
    case 0x7e:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0x95;
      break;
    case 0x7f:
      if (uVar1 != 100) {
        return _Var6;
      }
      state = 0x96;
      break;
    case 0x80:
      lexer->result_symbol = 0x4e;
      goto LAB_0010376c;
    case 0x81:
      lexer->result_symbol = 0x38;
      goto LAB_0010376c;
    case 0x82:
      if (uVar1 != 0x6c) {
        return _Var6;
      }
      state = 0x97;
      break;
    case 0x83:
      lexer->result_symbol = 0x22;
      goto LAB_0010376c;
    case 0x84:
      if (uVar1 != 0x6d) {
        return _Var6;
      }
      state = 0x98;
      break;
    case 0x85:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x99;
      break;
    case 0x86:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0x9a;
      break;
    case 0x87:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0x9b;
      break;
    case 0x88:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0x9c;
      break;
    case 0x89:
      if (uVar1 != 0x70) {
        return _Var6;
      }
      state = 0x9d;
      break;
    case 0x8a:
      lexer->result_symbol = 0x32;
      goto LAB_0010376c;
    case 0x8b:
      if (uVar1 != 99) {
        return _Var6;
      }
      state = 0x9e;
      break;
    case 0x8c:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0x9f;
      break;
    case 0x8d:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0xa0;
      break;
    case 0x8e:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0xa1;
      break;
    case 0x8f:
      if (uVar1 != 0x67) {
        return _Var6;
      }
      state = 0xa2;
      break;
    case 0x90:
      lexer->result_symbol = 0x51;
      goto LAB_0010376c;
    case 0x91:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0xa3;
      break;
    case 0x92:
      lexer->result_symbol = 0x12;
      goto LAB_0010376c;
    case 0x93:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0xa4;
      break;
    case 0x94:
      lexer->result_symbol = 0x3d;
      goto LAB_0010376c;
    case 0x95:
      lexer->result_symbol = 0x20;
      goto LAB_0010376c;
    case 0x96:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0xa5;
      break;
    case 0x97:
      lexer->result_symbol = 0x21;
      goto LAB_0010376c;
    case 0x98:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0xa6;
      break;
    case 0x99:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0xa7;
      break;
    case 0x9a:
      lexer->result_symbol = 9;
      goto LAB_0010376c;
    case 0x9b:
      if (uVar1 != 99) {
        return _Var6;
      }
      state = 0xa8;
      break;
    case 0x9c:
      lexer->result_symbol = 2;
      goto LAB_0010376c;
    case 0x9d:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0xa9;
      break;
    case 0x9e:
      if (uVar1 != 0x61) {
        return _Var6;
      }
      state = 0xaa;
      break;
    case 0x9f:
      lexer->result_symbol = 0x50;
      goto LAB_0010376c;
    case 0xa0:
      lexer->result_symbol = 0x13;
      goto LAB_0010376c;
    case 0xa1:
      if (uVar1 == 99) {
        state = 0xab;
      }
      else {
        if (uVar1 != 0x73) {
          return _Var6;
        }
        state = 0xac;
      }
      break;
    case 0xa2:
      lexer->result_symbol = 0x3a;
      goto LAB_0010376c;
    case 0xa3:
      lexer->result_symbol = 0x47;
      goto LAB_0010376c;
    case 0xa4:
      lexer->result_symbol = 0x36;
      goto LAB_0010376c;
    case 0xa5:
      lexer->result_symbol = 0x15;
      goto LAB_0010376c;
    case 0xa6:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0xad;
      break;
    case 0xa7:
      lexer->result_symbol = 0x1d;
      goto LAB_0010376c;
    case 0xa8:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0xae;
      break;
    case 0xa9:
      lexer->result_symbol = 0x10;
      goto LAB_0010376c;
    case 0xaa:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0xaf;
      break;
    case 0xab:
      if (uVar1 != 0x6f) {
        return _Var6;
      }
      state = 0xb0;
      break;
    case 0xac:
      if (uVar1 != 0x75) {
        return _Var6;
      }
      state = 0xb1;
      break;
    case 0xad:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0xb2;
      break;
    case 0xae:
      if (uVar1 != 0x6f) {
        return _Var6;
      }
      state = 0xb3;
      break;
    case 0xaf:
      if (uVar1 != 0x65) {
        return _Var6;
      }
      state = 0xb4;
      break;
    case 0xb0:
      if (uVar1 == 0x6e) {
        state = 0xb5;
      }
      else {
        if (uVar1 != 0x75) {
          return _Var6;
        }
        state = 0xb6;
      }
      break;
    case 0xb1:
      if (uVar1 != 0x6d) {
        return _Var6;
      }
      state = 0xb7;
      break;
    case 0xb2:
      if (uVar1 != 0x73) {
        return _Var6;
      }
      state = 0xb8;
      break;
    case 0xb3:
      if (uVar1 != 0x66) {
        return _Var6;
      }
      state = 0xb9;
      break;
    case 0xb4:
      lexer->result_symbol = 0x4f;
      goto LAB_0010376c;
    case 0xb5:
      if (uVar1 != 99) {
        return _Var6;
      }
      state = 0xba;
      break;
    case 0xb6:
      if (uVar1 != 0x6e) {
        return _Var6;
      }
      state = 0xbb;
      break;
    case 0xb7:
      lexer->result_symbol = 0x44;
      goto LAB_0010376c;
    case 0xb8:
      lexer->result_symbol = 6;
      goto LAB_0010376c;
    case 0xb9:
      lexer->result_symbol = 0x16;
      goto LAB_0010376c;
    case 0xba:
      if (uVar1 != 0x61) {
        return _Var6;
      }
      state = 0xbc;
      break;
    case 0xbb:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0xbd;
      break;
    case 0xbc:
      if (uVar1 != 0x74) {
        return _Var6;
      }
      state = 0xbe;
      break;
    case 0xbd:
      lexer->result_symbol = 0x43;
      goto LAB_0010376c;
    case 0xbe:
      lexer->result_symbol = 0x3e;
      goto LAB_0010376c;
    default:
      return false;
    }
    _Var3 = false;
LAB_00103558:
    (*lexer->advance)(lexer,_Var3);
  } while( true );
}

Assistant:

static bool ts_lex_keywords(TSLexer *lexer, TSStateId state) {
  START_LEXER();
  eof = lexer->eof(lexer);
  switch (state) {
    case 0:
      ADVANCE_MAP(
        'a', 1,
        'b', 2,
        'c', 3,
        'd', 4,
        'e', 5,
        'f', 6,
        'i', 7,
        'm', 8,
        'n', 9,
        'o', 10,
        'p', 11,
        'r', 12,
        's', 13,
        't', 14,
        'u', 15,
        'w', 16,
      );
      if (lookahead == '\t' ||
          lookahead == '\n' ||
          lookahead == '\r' ||
          lookahead == ' ') SKIP(0);
      END_STATE();
    case 1:
      if (lookahead == 'n') ADVANCE(17);
      if (lookahead == 's') ADVANCE(18);
      if (lookahead == 'v') ADVANCE(19);
      END_STATE();
    case 2:
      if (lookahead == 'o') ADVANCE(20);
      if (lookahead == 'y') ADVANCE(21);
      END_STATE();
    case 3:
      if (lookahead == 'l') ADVANCE(22);
      if (lookahead == 'o') ADVANCE(23);
      END_STATE();
    case 4:
      if (lookahead == 'a') ADVANCE(24);
      if (lookahead == 'e') ADVANCE(25);
      END_STATE();
    case 5:
      if (lookahead == 'l') ADVANCE(26);
      if (lookahead == 'x') ADVANCE(27);
      END_STATE();
    case 6:
      if (lookahead == 'a') ADVANCE(28);
      if (lookahead == 'l') ADVANCE(29);
      if (lookahead == 'o') ADVANCE(30);
      if (lookahead == 'r') ADVANCE(31);
      END_STATE();
    case 7:
      if (lookahead == 'f') ADVANCE(32);
      if (lookahead == 'm') ADVANCE(33);
      if (lookahead == 'n') ADVANCE(34);
      END_STATE();
    case 8:
      if (lookahead == 'a') ADVANCE(35);
      if (lookahead == 'i') ADVANCE(36);
      if (lookahead == 'o') ADVANCE(37);
      END_STATE();
    case 9:
      if (lookahead == 'e') ADVANCE(38);
      if (lookahead == 'o') ADVANCE(39);
      END_STATE();
    case 10:
      if (lookahead == 'r') ADVANCE(40);
      END_STATE();
    case 11:
      if (lookahead == 'r') ADVANCE(41);
      END_STATE();
    case 12:
      if (lookahead == 'a') ADVANCE(42);
      if (lookahead == 'e') ADVANCE(43);
      END_STATE();
    case 13:
      if (lookahead == 'e') ADVANCE(44);
      if (lookahead == 't') ADVANCE(45);
      if (lookahead == 'u') ADVANCE(46);
      END_STATE();
    case 14:
      if (lookahead == 'h') ADVANCE(47);
      if (lookahead == 'r') ADVANCE(48);
      END_STATE();
    case 15:
      if (lookahead == 'n') ADVANCE(49);
      END_STATE();
    case 16:
      if (lookahead == 'h') ADVANCE(50);
      END_STATE();
    case 17:
      if (lookahead == 'd') ADVANCE(51);
      if (lookahead == 'y') ADVANCE(52);
      END_STATE();
    case 18:
      ACCEPT_TOKEN(anon_sym_as);
      if (lookahead == 'c') ADVANCE(53);
      END_STATE();
    case 19:
      if (lookahead == 'g') ADVANCE(54);
      END_STATE();
    case 20:
      if (lookahead == 'o') ADVANCE(55);
      END_STATE();
    case 21:
      ACCEPT_TOKEN(anon_sym_by);
      END_STATE();
    case 22:
      if (lookahead == 'a') ADVANCE(56);
      END_STATE();
    case 23:
      if (lookahead == 'n') ADVANCE(57);
      if (lookahead == 'u') ADVANCE(58);
      END_STATE();
    case 24:
      if (lookahead == 't') ADVANCE(59);
      END_STATE();
    case 25:
      if (lookahead == 's') ADVANCE(60);
      END_STATE();
    case 26:
      if (lookahead == 's') ADVANCE(61);
      END_STATE();
    case 27:
      if (lookahead == 'i') ADVANCE(62);
      if (lookahead == 't') ADVANCE(63);
      END_STATE();
    case 28:
      if (lookahead == 'l') ADVANCE(64);
      END_STATE();
    case 29:
      if (lookahead == 'o') ADVANCE(65);
      END_STATE();
    case 30:
      if (lookahead == 'r') ADVANCE(66);
      END_STATE();
    case 31:
      if (lookahead == 'o') ADVANCE(67);
      END_STATE();
    case 32:
      ACCEPT_TOKEN(anon_sym_if);
      END_STATE();
    case 33:
      if (lookahead == 'p') ADVANCE(68);
      END_STATE();
    case 34:
      ACCEPT_TOKEN(anon_sym_in);
      if (lookahead == 's') ADVANCE(69);
      if (lookahead == 't') ADVANCE(70);
      END_STATE();
    case 35:
      if (lookahead == 'x') ADVANCE(71);
      END_STATE();
    case 36:
      if (lookahead == 'n') ADVANCE(72);
      END_STATE();
    case 37:
      if (lookahead == 'd') ADVANCE(73);
      END_STATE();
    case 38:
      if (lookahead == 'w') ADVANCE(74);
      END_STATE();
    case 39:
      if (lookahead == 'n') ADVANCE(75);
      if (lookahead == 't') ADVANCE(76);
      END_STATE();
    case 40:
      ACCEPT_TOKEN(anon_sym_or);
      if (lookahead == 'd') ADVANCE(77);
      END_STATE();
    case 41:
      if (lookahead == 'e') ADVANCE(78);
      END_STATE();
    case 42:
      if (lookahead == 'n') ADVANCE(79);
      END_STATE();
    case 43:
      if (lookahead == 's') ADVANCE(80);
      END_STATE();
    case 44:
      if (lookahead == 'l') ADVANCE(81);
      END_STATE();
    case 45:
      if (lookahead == 'r') ADVANCE(82);
      END_STATE();
    case 46:
      if (lookahead == 'm') ADVANCE(83);
      if (lookahead == 'p') ADVANCE(84);
      END_STATE();
    case 47:
      if (lookahead == 'e') ADVANCE(85);
      if (lookahead == 'i') ADVANCE(86);
      END_STATE();
    case 48:
      if (lookahead == 'u') ADVANCE(87);
      END_STATE();
    case 49:
      if (lookahead == 'i') ADVANCE(88);
      END_STATE();
    case 50:
      if (lookahead == 'e') ADVANCE(89);
      END_STATE();
    case 51:
      ACCEPT_TOKEN(anon_sym_and);
      END_STATE();
    case 52:
      ACCEPT_TOKEN(anon_sym_any);
      END_STATE();
    case 53:
      ACCEPT_TOKEN(anon_sym_asc);
      END_STATE();
    case 54:
      ACCEPT_TOKEN(anon_sym_avg);
      END_STATE();
    case 55:
      if (lookahead == 'l') ADVANCE(90);
      END_STATE();
    case 56:
      if (lookahead == 's') ADVANCE(91);
      END_STATE();
    case 57:
      if (lookahead == 'c') ADVANCE(92);
      END_STATE();
    case 58:
      if (lookahead == 'n') ADVANCE(93);
      END_STATE();
    case 59:
      if (lookahead == 'e') ADVANCE(94);
      END_STATE();
    case 60:
      if (lookahead == 'c') ADVANCE(95);
      END_STATE();
    case 61:
      if (lookahead == 'e') ADVANCE(96);
      END_STATE();
    case 62:
      if (lookahead == 's') ADVANCE(97);
      END_STATE();
    case 63:
      if (lookahead == 'e') ADVANCE(98);
      END_STATE();
    case 64:
      if (lookahead == 's') ADVANCE(99);
      END_STATE();
    case 65:
      if (lookahead == 'a') ADVANCE(100);
      END_STATE();
    case 66:
      if (lookahead == 'a') ADVANCE(101);
      if (lookahead == 'e') ADVANCE(102);
      END_STATE();
    case 67:
      if (lookahead == 'm') ADVANCE(103);
      END_STATE();
    case 68:
      if (lookahead == 'l') ADVANCE(104);
      if (lookahead == 'o') ADVANCE(105);
      END_STATE();
    case 69:
      if (lookahead == 't') ADVANCE(106);
      END_STATE();
    case 70:
      ACCEPT_TOKEN(anon_sym_int);
      END_STATE();
    case 71:
      ACCEPT_TOKEN(anon_sym_max);
      END_STATE();
    case 72:
      ACCEPT_TOKEN(anon_sym_min);
      END_STATE();
    case 73:
      if (lookahead == 'u') ADVANCE(107);
      END_STATE();
    case 74:
      if (lookahead == 't') ADVANCE(108);
      END_STATE();
    case 75:
      if (lookahead == 'e') ADVANCE(109);
      END_STATE();
    case 76:
      ACCEPT_TOKEN(anon_sym_not);
      END_STATE();
    case 77:
      if (lookahead == 'e') ADVANCE(110);
      END_STATE();
    case 78:
      if (lookahead == 'd') ADVANCE(111);
      END_STATE();
    case 79:
      if (lookahead == 'k') ADVANCE(112);
      END_STATE();
    case 80:
      if (lookahead == 'u') ADVANCE(113);
      END_STATE();
    case 81:
      if (lookahead == 'e') ADVANCE(114);
      END_STATE();
    case 82:
      if (lookahead == 'i') ADVANCE(115);
      END_STATE();
    case 83:
      ACCEPT_TOKEN(anon_sym_sum);
      END_STATE();
    case 84:
      if (lookahead == 'e') ADVANCE(116);
      END_STATE();
    case 85:
      if (lookahead == 'n') ADVANCE(117);
      END_STATE();
    case 86:
      if (lookahead == 's') ADVANCE(118);
      END_STATE();
    case 87:
      if (lookahead == 'e') ADVANCE(119);
      END_STATE();
    case 88:
      if (lookahead == 'q') ADVANCE(120);
      END_STATE();
    case 89:
      if (lookahead == 'r') ADVANCE(121);
      END_STATE();
    case 90:
      if (lookahead == 'e') ADVANCE(122);
      END_STATE();
    case 91:
      if (lookahead == 's') ADVANCE(123);
      END_STATE();
    case 92:
      if (lookahead == 'a') ADVANCE(124);
      END_STATE();
    case 93:
      if (lookahead == 't') ADVANCE(125);
      END_STATE();
    case 94:
      ACCEPT_TOKEN(anon_sym_date);
      END_STATE();
    case 95:
      ACCEPT_TOKEN(anon_sym_desc);
      END_STATE();
    case 96:
      ACCEPT_TOKEN(anon_sym_else);
      END_STATE();
    case 97:
      if (lookahead == 't') ADVANCE(126);
      END_STATE();
    case 98:
      if (lookahead == 'n') ADVANCE(127);
      END_STATE();
    case 99:
      if (lookahead == 'e') ADVANCE(128);
      END_STATE();
    case 100:
      if (lookahead == 't') ADVANCE(129);
      END_STATE();
    case 101:
      if (lookahead == 'l') ADVANCE(130);
      END_STATE();
    case 102:
      if (lookahead == 'x') ADVANCE(131);
      END_STATE();
    case 103:
      ACCEPT_TOKEN(anon_sym_from);
      END_STATE();
    case 104:
      if (lookahead == 'e') ADVANCE(132);
      if (lookahead == 'i') ADVANCE(133);
      END_STATE();
    case 105:
      if (lookahead == 'r') ADVANCE(134);
      END_STATE();
    case 106:
      if (lookahead == 'a') ADVANCE(135);
      END_STATE();
    case 107:
      if (lookahead == 'l') ADVANCE(136);
      END_STATE();
    case 108:
      if (lookahead == 'y') ADVANCE(137);
      END_STATE();
    case 109:
      ACCEPT_TOKEN(sym_specialId);
      END_STATE();
    case 110:
      if (lookahead == 'r') ADVANCE(138);
      END_STATE();
    case 111:
      if (lookahead == 'i') ADVANCE(139);
      END_STATE();
    case 112:
      ACCEPT_TOKEN(anon_sym_rank);
      END_STATE();
    case 113:
      if (lookahead == 'l') ADVANCE(140);
      END_STATE();
    case 114:
      if (lookahead == 'c') ADVANCE(141);
      END_STATE();
    case 115:
      if (lookahead == 'c') ADVANCE(142);
      if (lookahead == 'n') ADVANCE(143);
      END_STATE();
    case 116:
      if (lookahead == 'r') ADVANCE(144);
      END_STATE();
    case 117:
      ACCEPT_TOKEN(anon_sym_then);
      END_STATE();
    case 118:
      ACCEPT_TOKEN(sym_this);
      END_STATE();
    case 119:
      ACCEPT_TOKEN(sym_true);
      END_STATE();
    case 120:
      if (lookahead == 'u') ADVANCE(145);
      END_STATE();
    case 121:
      if (lookahead == 'e') ADVANCE(146);
      END_STATE();
    case 122:
      if (lookahead == 'a') ADVANCE(147);
      END_STATE();
    case 123:
      ACCEPT_TOKEN(anon_sym_class);
      END_STATE();
    case 124:
      if (lookahead == 't') ADVANCE(148);
      END_STATE();
    case 125:
      ACCEPT_TOKEN(anon_sym_count);
      END_STATE();
    case 126:
      if (lookahead == 's') ADVANCE(149);
      END_STATE();
    case 127:
      if (lookahead == 'd') ADVANCE(150);
      END_STATE();
    case 128:
      ACCEPT_TOKEN(sym_false);
      END_STATE();
    case 129:
      ACCEPT_TOKEN(anon_sym_float);
      END_STATE();
    case 130:
      if (lookahead == 'l') ADVANCE(151);
      END_STATE();
    case 131:
      ACCEPT_TOKEN(anon_sym_forex);
      END_STATE();
    case 132:
      if (lookahead == 'm') ADVANCE(152);
      END_STATE();
    case 133:
      if (lookahead == 'e') ADVANCE(153);
      END_STATE();
    case 134:
      if (lookahead == 't') ADVANCE(154);
      END_STATE();
    case 135:
      if (lookahead == 'n') ADVANCE(155);
      END_STATE();
    case 136:
      if (lookahead == 'e') ADVANCE(156);
      END_STATE();
    case 137:
      if (lookahead == 'p') ADVANCE(157);
      END_STATE();
    case 138:
      ACCEPT_TOKEN(anon_sym_order);
      END_STATE();
    case 139:
      if (lookahead == 'c') ADVANCE(158);
      END_STATE();
    case 140:
      if (lookahead == 't') ADVANCE(159);
      END_STATE();
    case 141:
      if (lookahead == 't') ADVANCE(160);
      END_STATE();
    case 142:
      if (lookahead == 't') ADVANCE(161);
      END_STATE();
    case 143:
      if (lookahead == 'g') ADVANCE(162);
      END_STATE();
    case 144:
      ACCEPT_TOKEN(sym_super);
      END_STATE();
    case 145:
      if (lookahead == 'e') ADVANCE(163);
      END_STATE();
    case 146:
      ACCEPT_TOKEN(anon_sym_where);
      END_STATE();
    case 147:
      if (lookahead == 'n') ADVANCE(164);
      END_STATE();
    case 148:
      ACCEPT_TOKEN(anon_sym_concat);
      END_STATE();
    case 149:
      ACCEPT_TOKEN(anon_sym_exists);
      END_STATE();
    case 150:
      if (lookahead == 's') ADVANCE(165);
      END_STATE();
    case 151:
      ACCEPT_TOKEN(anon_sym_forall);
      END_STATE();
    case 152:
      if (lookahead == 'e') ADVANCE(166);
      END_STATE();
    case 153:
      if (lookahead == 's') ADVANCE(167);
      END_STATE();
    case 154:
      ACCEPT_TOKEN(anon_sym_import);
      END_STATE();
    case 155:
      if (lookahead == 'c') ADVANCE(168);
      END_STATE();
    case 156:
      ACCEPT_TOKEN(anon_sym_module);
      END_STATE();
    case 157:
      if (lookahead == 'e') ADVANCE(169);
      END_STATE();
    case 158:
      if (lookahead == 'a') ADVANCE(170);
      END_STATE();
    case 159:
      ACCEPT_TOKEN(sym_result);
      END_STATE();
    case 160:
      ACCEPT_TOKEN(anon_sym_select);
      END_STATE();
    case 161:
      if (lookahead == 'c') ADVANCE(171);
      if (lookahead == 's') ADVANCE(172);
      END_STATE();
    case 162:
      ACCEPT_TOKEN(anon_sym_string);
      END_STATE();
    case 163:
      ACCEPT_TOKEN(anon_sym_unique);
      END_STATE();
    case 164:
      ACCEPT_TOKEN(anon_sym_boolean);
      END_STATE();
    case 165:
      ACCEPT_TOKEN(anon_sym_extends);
      END_STATE();
    case 166:
      if (lookahead == 'n') ADVANCE(173);
      END_STATE();
    case 167:
      ACCEPT_TOKEN(anon_sym_implies);
      END_STATE();
    case 168:
      if (lookahead == 'e') ADVANCE(174);
      END_STATE();
    case 169:
      ACCEPT_TOKEN(anon_sym_newtype);
      END_STATE();
    case 170:
      if (lookahead == 't') ADVANCE(175);
      END_STATE();
    case 171:
      if (lookahead == 'o') ADVANCE(176);
      END_STATE();
    case 172:
      if (lookahead == 'u') ADVANCE(177);
      END_STATE();
    case 173:
      if (lookahead == 't') ADVANCE(178);
      END_STATE();
    case 174:
      if (lookahead == 'o') ADVANCE(179);
      END_STATE();
    case 175:
      if (lookahead == 'e') ADVANCE(180);
      END_STATE();
    case 176:
      if (lookahead == 'n') ADVANCE(181);
      if (lookahead == 'u') ADVANCE(182);
      END_STATE();
    case 177:
      if (lookahead == 'm') ADVANCE(183);
      END_STATE();
    case 178:
      if (lookahead == 's') ADVANCE(184);
      END_STATE();
    case 179:
      if (lookahead == 'f') ADVANCE(185);
      END_STATE();
    case 180:
      ACCEPT_TOKEN(sym_predicate);
      END_STATE();
    case 181:
      if (lookahead == 'c') ADVANCE(186);
      END_STATE();
    case 182:
      if (lookahead == 'n') ADVANCE(187);
      END_STATE();
    case 183:
      ACCEPT_TOKEN(anon_sym_strictsum);
      END_STATE();
    case 184:
      ACCEPT_TOKEN(anon_sym_implements);
      END_STATE();
    case 185:
      ACCEPT_TOKEN(anon_sym_instanceof);
      END_STATE();
    case 186:
      if (lookahead == 'a') ADVANCE(188);
      END_STATE();
    case 187:
      if (lookahead == 't') ADVANCE(189);
      END_STATE();
    case 188:
      if (lookahead == 't') ADVANCE(190);
      END_STATE();
    case 189:
      ACCEPT_TOKEN(anon_sym_strictcount);
      END_STATE();
    case 190:
      ACCEPT_TOKEN(anon_sym_strictconcat);
      END_STATE();
    default:
      return false;
  }
}